

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O3

string * __thiscall
t_rs_generator::rust_union_field_name_abi_cxx11_
          (string *__return_storage_ptr__,t_rs_generator *this,t_field *tfield)

{
  string base_field_name;
  string local_30;
  
  rust_camel_case(&local_30,this,&tfield->name_);
  rust_safe_name(__return_storage_ptr__,this,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_rs_generator::rust_union_field_name(t_field* tfield) {
  string base_field_name(rust_camel_case(tfield->get_name()));
  return rust_safe_name(base_field_name);
}